

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinPC07OPT_K>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  undefined8 *puVar1;
  double *in_RCX;
  double in_RDX;
  double unaff_RBX;
  double in_RSI;
  int in_EDI;
  double *in_R8;
  double *in_R9;
  double unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double vlb;
  double vla;
  double lapl_b_use;
  double lapl_a_use;
  double *vlapl_i;
  double *vtau_i;
  double *vsigma_i;
  double *vrho_i;
  double *lapl_i;
  double *tau_i;
  double *sigma_i;
  double *rho_i;
  int32_t i;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  for (iVar2 = 0; iVar2 < in_EDI; iVar2 = iVar2 + 1) {
    puVar1 = (undefined8 *)((long)in_stack_00000018 + (long)(iVar2 << 1) * 8);
    mgga_screening_interface<ExchCXX::BuiltinPC07OPT_K>::eval_exc_vxc_polar
              (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,
               (double)CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_RSI,in_RDX,vla,in_RCX,in_R8,
               in_R9,(double *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
               (double *)((long)in_RSI + (long)(iVar2 << 1) * 8),
               (double *)((long)in_RDX + (long)(iVar2 * 3) * 8),(double *)lapl_b_use,
               (double *)lapl_a_use,vlapl_i,vtau_i);
    *puVar1 = local_98;
    puVar1[1] = local_a0;
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;


    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double vla, vlb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      eps[i], vrho_i[0], vrho_i[1],
      vsigma_i[0], vsigma_i[1], vsigma_i[2], vla, vlb,
      vtau_i[0], vtau_i[1] );
    if(traits::needs_laplacian) {
      vlapl_i[0] = vla;
      vlapl_i[1] = vlb;
    }

  }

}